

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

uint32_t av1_write_sequence_header_obu(SequenceHeader *seq_params,uint8_t *dst,size_t dst_size)

{
  int bits;
  char cVar1;
  uint32_t uVar2;
  uint uVar3;
  int *piVar4;
  byte bVar5;
  long lVar6;
  aom_write_bit_buffer wb;
  
  wb.bit_offset = 0;
  wb.bit_buffer = dst;
  aom_wb_write_literal(&wb,(int)seq_params->profile,3);
  aom_wb_write_bit(&wb,(uint)seq_params->still_picture);
  aom_wb_write_bit(&wb,(uint)seq_params->reduced_still_picture_hdr);
  if (seq_params->reduced_still_picture_hdr == '\0') {
    aom_wb_write_bit(&wb,seq_params->timing_info_present);
    if (seq_params->timing_info_present != 0) {
      aom_wb_write_unsigned_literal(&wb,(seq_params->timing_info).num_units_in_display_tick,0x20);
      aom_wb_write_unsigned_literal(&wb,(seq_params->timing_info).time_scale,0x20);
      aom_wb_write_bit(&wb,(seq_params->timing_info).equal_picture_interval);
      if ((seq_params->timing_info).equal_picture_interval != 0) {
        aom_wb_write_uvlc(&wb,(seq_params->timing_info).num_ticks_per_picture - 1);
      }
      aom_wb_write_bit(&wb,(uint)seq_params->decoder_model_info_present_flag);
      if (seq_params->decoder_model_info_present_flag != '\0') {
        aom_wb_write_literal
                  (&wb,(seq_params->decoder_model_info).encoder_decoder_buffer_delay_length + -1,5);
        aom_wb_write_unsigned_literal
                  (&wb,(seq_params->decoder_model_info).num_units_in_decoding_tick,0x20);
        aom_wb_write_literal(&wb,(seq_params->decoder_model_info).buffer_removal_time_length + -1,5)
        ;
        aom_wb_write_literal
                  (&wb,(seq_params->decoder_model_info).frame_presentation_time_length + -1,5);
      }
    }
    aom_wb_write_bit(&wb,(uint)seq_params->display_model_info_present_flag);
    aom_wb_write_literal(&wb,seq_params->operating_points_cnt_minus_1,5);
    piVar4 = &seq_params->op_params[0].initial_display_delay;
    for (lVar6 = 0; lVar6 <= seq_params->operating_points_cnt_minus_1; lVar6 = lVar6 + 1) {
      aom_wb_write_literal(&wb,seq_params->operating_point_idc[lVar6],0xc);
      write_bitstream_level(seq_params->seq_level_idx[lVar6],&wb);
      if (7 < seq_params->seq_level_idx[lVar6]) {
        aom_wb_write_bit(&wb,(uint)seq_params->tier[lVar6]);
      }
      if (seq_params->decoder_model_info_present_flag != '\0') {
        aom_wb_write_bit(&wb,((aom_dec_model_op_parameters_t *)(piVar4 + -10))->
                             decoder_model_param_present_flag);
        if (((aom_dec_model_op_parameters_t *)(piVar4 + -10))->decoder_model_param_present_flag != 0
           ) {
          bits = (seq_params->decoder_model_info).encoder_decoder_buffer_delay_length;
          aom_wb_write_unsigned_literal(&wb,piVar4[-4],bits);
          aom_wb_write_unsigned_literal(&wb,piVar4[-3],bits);
          aom_wb_write_bit(&wb,piVar4[-2]);
        }
      }
      if (seq_params->display_model_info_present_flag != '\0') {
        aom_wb_write_bit(&wb,piVar4[-1]);
        if (piVar4[-1] != 0) {
          aom_wb_write_literal(&wb,*piVar4 + -1,4);
        }
      }
      piVar4 = piVar4 + 0xc;
    }
  }
  else {
    write_bitstream_level(seq_params->seq_level_idx[0],&wb);
  }
  aom_wb_write_literal(&wb,seq_params->num_bits_width + -1,4);
  aom_wb_write_literal(&wb,seq_params->num_bits_height + -1,4);
  aom_wb_write_literal(&wb,seq_params->max_frame_width + -1,seq_params->num_bits_width);
  aom_wb_write_literal(&wb,seq_params->max_frame_height + -1,seq_params->num_bits_height);
  if (seq_params->reduced_still_picture_hdr == '\0') {
    aom_wb_write_bit(&wb,(uint)seq_params->frame_id_numbers_present_flag);
    if (seq_params->frame_id_numbers_present_flag != '\0') {
      aom_wb_write_literal(&wb,seq_params->delta_frame_id_length + -2,4);
      aom_wb_write_literal(&wb,~seq_params->delta_frame_id_length + seq_params->frame_id_length,3);
    }
  }
  aom_wb_write_bit(&wb,(uint)(seq_params->sb_size == BLOCK_128X128));
  aom_wb_write_bit(&wb,(uint)seq_params->enable_filter_intra);
  aom_wb_write_bit(&wb,(uint)seq_params->enable_intra_edge_filter);
  if (seq_params->reduced_still_picture_hdr == '\0') {
    aom_wb_write_bit(&wb,(uint)seq_params->enable_interintra_compound);
    aom_wb_write_bit(&wb,(uint)seq_params->enable_masked_compound);
    aom_wb_write_bit(&wb,(uint)seq_params->enable_warped_motion);
    aom_wb_write_bit(&wb,(uint)seq_params->enable_dual_filter);
    aom_wb_write_bit(&wb,(seq_params->order_hint_info).enable_order_hint);
    if ((seq_params->order_hint_info).enable_order_hint != 0) {
      aom_wb_write_bit(&wb,(seq_params->order_hint_info).enable_dist_wtd_comp);
      aom_wb_write_bit(&wb,(seq_params->order_hint_info).enable_ref_frame_mvs);
    }
    if (seq_params->force_screen_content_tools == '\x02') {
      uVar3 = 1;
    }
    else {
      aom_wb_write_bit(&wb,0);
      uVar3 = (uint)seq_params->force_screen_content_tools;
    }
    aom_wb_write_bit(&wb,uVar3);
    if (seq_params->force_screen_content_tools != '\0') {
      if (seq_params->force_integer_mv == '\x02') {
        uVar3 = 1;
      }
      else {
        aom_wb_write_bit(&wb,0);
        uVar3 = (uint)seq_params->force_integer_mv;
      }
      aom_wb_write_bit(&wb,uVar3);
    }
    if ((seq_params->order_hint_info).enable_order_hint != 0) {
      aom_wb_write_literal(&wb,(seq_params->order_hint_info).order_hint_bits_minus_1,3);
    }
  }
  aom_wb_write_bit(&wb,(uint)seq_params->enable_superres);
  aom_wb_write_bit(&wb,(uint)seq_params->enable_cdef);
  aom_wb_write_bit(&wb,(uint)seq_params->enable_restoration);
  aom_wb_write_bit(&wb,(uint)(seq_params->bit_depth != AOM_BITS_8));
  cVar1 = seq_params->profile;
  if (cVar1 == '\x02') {
    if (seq_params->bit_depth != AOM_BITS_8) {
      aom_wb_write_bit(&wb,(uint)(seq_params->bit_depth != AOM_BITS_10));
      cVar1 = seq_params->profile;
      goto LAB_0018df84;
    }
    bVar5 = seq_params->monochrome;
  }
  else {
LAB_0018df84:
    bVar5 = seq_params->monochrome;
    if (cVar1 == '\x01') goto LAB_0018df9a;
  }
  aom_wb_write_bit(&wb,(uint)bVar5);
LAB_0018df9a:
  if (((seq_params->color_primaries == AOM_CICP_CP_UNSPECIFIED) &&
      (seq_params->transfer_characteristics == AOM_CICP_TC_UNSPECIFIED)) &&
     (seq_params->matrix_coefficients == AOM_CICP_MC_UNSPECIFIED)) {
    aom_wb_write_bit(&wb,0);
  }
  else {
    aom_wb_write_bit(&wb,1);
    aom_wb_write_literal(&wb,seq_params->color_primaries,8);
    aom_wb_write_literal(&wb,seq_params->transfer_characteristics,8);
    aom_wb_write_literal(&wb,seq_params->matrix_coefficients,8);
  }
  if (bVar5 == 0) {
    if (((seq_params->color_primaries != AOM_CICP_CP_BT_709) ||
        (seq_params->transfer_characteristics != AOM_CICP_TC_SRGB)) ||
       (seq_params->matrix_coefficients != AOM_CICP_MC_IDENTITY)) {
      aom_wb_write_bit(&wb,seq_params->color_range);
      if ((seq_params->profile == '\x02') && (seq_params->bit_depth == AOM_BITS_12)) {
        aom_wb_write_bit(&wb,seq_params->subsampling_x);
        if (seq_params->subsampling_x != 0) {
          aom_wb_write_bit(&wb,seq_params->subsampling_y);
        }
      }
      if ((seq_params->subsampling_x == 1) && (seq_params->subsampling_y == 1)) {
        aom_wb_write_literal(&wb,seq_params->chroma_sample_position,2);
      }
    }
    uVar3 = (uint)seq_params->separate_uv_delta_q;
  }
  else {
    uVar3 = seq_params->color_range;
  }
  aom_wb_write_bit(&wb,uVar3);
  aom_wb_write_bit(&wb,(uint)seq_params->film_grain_params_present);
  add_trailing_bits(&wb);
  uVar2 = aom_wb_bytes_written(&wb);
  return uVar2;
}

Assistant:

uint32_t av1_write_sequence_header_obu(const SequenceHeader *seq_params,
                                       uint8_t *const dst, size_t dst_size) {
  // TODO: bug 42302568 - Use dst_size.
  (void)dst_size;
  struct aom_write_bit_buffer wb = { dst, 0 };
  uint32_t size = 0;

  write_profile(seq_params->profile, &wb);

  // Still picture or not
  aom_wb_write_bit(&wb, seq_params->still_picture);
  assert(IMPLIES(!seq_params->still_picture,
                 !seq_params->reduced_still_picture_hdr));
  // whether to use reduced still picture header
  aom_wb_write_bit(&wb, seq_params->reduced_still_picture_hdr);

  if (seq_params->reduced_still_picture_hdr) {
    assert(seq_params->timing_info_present == 0);
    assert(seq_params->decoder_model_info_present_flag == 0);
    assert(seq_params->display_model_info_present_flag == 0);
    write_bitstream_level(seq_params->seq_level_idx[0], &wb);
  } else {
    aom_wb_write_bit(
        &wb, seq_params->timing_info_present);  // timing info present flag

    if (seq_params->timing_info_present) {
      // timing_info
      write_timing_info_header(&seq_params->timing_info, &wb);
      aom_wb_write_bit(&wb, seq_params->decoder_model_info_present_flag);
      if (seq_params->decoder_model_info_present_flag) {
        write_decoder_model_info(&seq_params->decoder_model_info, &wb);
      }
    }
    aom_wb_write_bit(&wb, seq_params->display_model_info_present_flag);
    aom_wb_write_literal(&wb, seq_params->operating_points_cnt_minus_1,
                         OP_POINTS_CNT_MINUS_1_BITS);
    int i;
    for (i = 0; i < seq_params->operating_points_cnt_minus_1 + 1; i++) {
      aom_wb_write_literal(&wb, seq_params->operating_point_idc[i],
                           OP_POINTS_IDC_BITS);
      write_bitstream_level(seq_params->seq_level_idx[i], &wb);
      if (seq_params->seq_level_idx[i] >= SEQ_LEVEL_4_0)
        aom_wb_write_bit(&wb, seq_params->tier[i]);
      if (seq_params->decoder_model_info_present_flag) {
        aom_wb_write_bit(
            &wb, seq_params->op_params[i].decoder_model_param_present_flag);
        if (seq_params->op_params[i].decoder_model_param_present_flag) {
          write_dec_model_op_parameters(
              &seq_params->op_params[i],
              seq_params->decoder_model_info
                  .encoder_decoder_buffer_delay_length,
              &wb);
        }
      }
      if (seq_params->display_model_info_present_flag) {
        aom_wb_write_bit(
            &wb, seq_params->op_params[i].display_model_param_present_flag);
        if (seq_params->op_params[i].display_model_param_present_flag) {
          assert(seq_params->op_params[i].initial_display_delay >= 1);
          assert(seq_params->op_params[i].initial_display_delay <= 10);
          aom_wb_write_literal(
              &wb, seq_params->op_params[i].initial_display_delay - 1, 4);
        }
      }
    }
  }
  write_sequence_header(seq_params, &wb);

  write_color_config(seq_params, &wb);

  aom_wb_write_bit(&wb, seq_params->film_grain_params_present);

  add_trailing_bits(&wb);

  size = aom_wb_bytes_written(&wb);
  return size;
}